

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

int uECC_verify(uint8_t *public_key,uint8_t *hash,uint8_t *signature)

{
  uint64_t *puVar1;
  ulong *puVar2;
  ulong uVar3;
  uECC_word_t *puVar4;
  swordcount_t i;
  uint uVar5;
  int iVar6;
  long lVar7;
  swordcount_t i_1;
  int iVar8;
  uECC_word_t *puVar9;
  uECC_word_t *puVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  uECC_word_t local_258;
  uECC_word_t product [8];
  EccPoint sum;
  uECC_word_t tz [4];
  EccPoint public;
  uECC_word_t ry [4];
  uECC_word_t s [4];
  uECC_word_t u1 [4];
  uECC_word_t u2 [4];
  uECC_word_t tx [4];
  uECC_word_t ty [4];
  uECC_word_t r [4];
  uECC_word_t z [4];
  uECC_word_t rx [4];
  EccPoint *points [4];
  
  r[2] = 0;
  s[2] = 0;
  vli_bytesToNative(tz + 3,public_key);
  vli_bytesToNative(public.x + 3,public_key + 0x20);
  vli_bytesToNative(ty + 3,signature);
  vli_bytesToNative(ry + 3,signature + 0x20);
  lVar7 = 0;
  do {
    lVar13 = lVar7 + 3;
    if (ty[lVar13] != 0) break;
    bVar15 = lVar7 != 3;
    lVar7 = lVar7 + 1;
  } while (bVar15);
  if (ty[lVar13] == 0) {
    uVar5 = 0;
  }
  else {
    lVar7 = 0;
    do {
      lVar13 = lVar7 + 3;
      if (ry[lVar13] != 0) break;
      bVar15 = lVar7 != 3;
      lVar7 = lVar7 + 1;
    } while (bVar15);
    uVar5 = 0;
    if (ry[lVar13] != 0) {
      uVar12 = 3;
      puVar9 = curve_n;
      do {
        uVar11 = curve_n[uVar12];
        uVar3 = ty[(ulong)uVar12 + 3];
        if (uVar3 < uVar11) goto LAB_00118d88;
        bVar15 = uVar12 != 0;
        uVar12 = uVar12 - 1;
      } while ((bVar15) && (uVar3 <= uVar11));
      if (uVar3 < uVar11) {
LAB_00118d88:
        uVar12 = 3;
        do {
          uVar11 = curve_n[uVar12];
          uVar3 = ry[(ulong)uVar12 + 3];
          if (uVar3 < uVar11) goto LAB_00118db3;
          bVar15 = uVar12 != 0;
          uVar12 = uVar12 - 1;
        } while ((bVar15) && (uVar3 <= uVar11));
        if (uVar3 < uVar11) {
LAB_00118db3:
          puVar4 = r + 3;
          vli_modInv(puVar4,ry + 3,curve_n);
          puVar1 = s + 3;
          u1[2] = 0;
          vli_bytesToNative(puVar1,hash);
          vli_modMult_n(puVar1,puVar1,puVar4);
          vli_modMult_n(u1 + 3,ty + 3,puVar4);
          sum.x[1] = public.x[1];
          sum.x[2] = public.x[2];
          product[7] = tz[3];
          sum.x[0] = public.x[0];
          sum.x[3] = public.x[3];
          sum.y[0] = public.y[0];
          sum.y[1] = public.y[1];
          sum.y[2] = public.y[2];
          u2[3] = 0xf4a13945d898c296;
          tx[0] = 0x77037d812deb33a0;
          tx[1] = 0xf8bce6e563a440f2;
          tx[2] = 0x6b17d1f2e12c4247;
          tx[3] = 0xcbb6406837bf51f5;
          ty[0] = 0x2bce33576b315ece;
          ty[1] = 0x8ee7eb4a7c0f9e16;
          ty[2] = 0x4fe342e2fe1a7f9b;
          puVar10 = product + 7;
          vli_modSub(puVar4,puVar10,u2 + 3,puVar9);
          XYcZ_add(u2 + 3,tx + 3,puVar10,sum.x + 3);
          vli_modInv(puVar4,puVar4,curve_p);
          apply_z(puVar10,sum.x + 3,puVar4);
          rx[3] = 0;
          uVar5 = 3;
          do {
            if (s[(ulong)uVar5 + 3] != 0) goto LAB_00118f06;
            bVar15 = uVar5 != 0;
            uVar5 = uVar5 - 1;
          } while (bVar15);
          uVar5 = 0xffffffff;
LAB_00118f06:
          if (uVar5 == 0xffffffff) {
            iVar6 = 0;
          }
          else {
            uVar11 = s[(ulong)uVar5 + 3];
            lVar7 = 0x3f;
            if (uVar11 != 0) {
              for (; uVar11 >> lVar7 == 0; lVar7 = lVar7 + -1) {
              }
            }
            iVar6 = 0;
            if (uVar11 != 0) {
              iVar6 = ((uint)lVar7 ^ 0xffffffc0) + 0x41;
            }
            iVar6 = uVar5 * 0x40 + iVar6;
          }
          uVar5 = 3;
          do {
            if (u1[(ulong)uVar5 + 3] != 0) goto LAB_00118f53;
            bVar15 = uVar5 != 0;
            uVar5 = uVar5 - 1;
          } while (bVar15);
          uVar5 = 0xffffffff;
LAB_00118f53:
          if (uVar5 == 0xffffffff) {
            iVar8 = 0;
          }
          else {
            uVar11 = u1[(ulong)uVar5 + 3];
            lVar7 = 0x3f;
            if (uVar11 != 0) {
              for (; uVar11 >> lVar7 == 0; lVar7 = lVar7 + -1) {
              }
            }
            iVar8 = 0;
            if (uVar11 != 0) {
              iVar8 = ((uint)lVar7 ^ 0xffffffc0) + 0x41;
            }
            iVar8 = uVar5 * 0x40 + iVar8;
          }
          if (iVar8 < iVar6) {
            iVar8 = iVar6;
          }
          uVar11 = (ulong)(iVar8 - 1U);
          lVar7 = (long)((int)(iVar8 - 1U) >> 6);
          lVar7 = *(long *)((long)rx +
                           (ulong)((uint)((u1[lVar7 + 3] >> (uVar11 & 0x3f) & 1) != 0) * 0x10 +
                                  (uint)((s[lVar7 + 3] >> (uVar11 & 0x3f) & 1) != 0) * 8) + 0x18);
          lVar13 = 0;
          do {
            z[lVar13 + 3] = *(uECC_word_t *)(lVar7 + lVar13 * 8);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 4);
          public.y[3] = *(uECC_word_t *)(lVar7 + 0x20);
          ry[0] = *(uECC_word_t *)(lVar7 + 0x28);
          ry[1] = *(uECC_word_t *)(lVar7 + 0x30);
          ry[2] = *(uECC_word_t *)(lVar7 + 0x38);
          z[0] = 0;
          z[1] = 0;
          z[2] = 0;
          r[3] = 1;
          if (1 < iVar8) {
            puVar9 = z + 3;
            puVar1 = r + 3;
            do {
              iVar6 = (int)uVar11;
              uVar12 = iVar6 - 1;
              EccPoint_double_jacobian(puVar9,public.y + 3,puVar1);
              uVar5 = (uint)((u1[(ulong)(uVar12 >> 6) + 3] >> ((ulong)uVar12 & 0x3f) & 1) != 0) *
                      0x10;
              puVar10 = (uECC_word_t *)(ulong)uVar5;
              puVar4 = *(uECC_word_t **)
                        ((long)rx +
                        (ulong)(uVar5 + (uint)((s[(ulong)(uVar12 >> 6) + 3] >>
                                                ((ulong)uVar12 & 0x3f) & 1) != 0) * 8) + 0x18);
              if (puVar4 != (uECC_word_t *)0x0) {
                u2[3] = *puVar4;
                tx[0] = puVar4[1];
                tx[1] = puVar4[2];
                tx[2] = puVar4[3];
                tx[3] = puVar4[4];
                ty[0] = puVar4[5];
                ty[1] = puVar4[6];
                ty[2] = puVar4[7];
                apply_z(u2 + 3,tx + 3,puVar1);
                vli_modSub(sum.y + 3,puVar9,u2 + 3,puVar10);
                XYcZ_add(u2 + 3,tx + 3,puVar9,public.y + 3);
                vli_mult(&local_258,puVar1,sum.y + 3);
                vli_mmod_fast(puVar1,&local_258);
              }
              uVar11 = (ulong)(iVar6 - 1U);
            } while (iVar6 - 1U != 0 && 0 < iVar6);
          }
          puVar9 = r + 3;
          vli_modInv(puVar9,puVar9,curve_p);
          apply_z(z + 3,public.y + 3,puVar9);
          uVar5 = 3;
          do {
            uVar11 = curve_n[uVar5];
            uVar3 = z[(ulong)uVar5 + 3];
            if (uVar3 < uVar11) goto LAB_0011918b;
            bVar15 = uVar5 != 0;
            uVar5 = uVar5 - 1;
          } while ((bVar15) && (uVar3 <= uVar11));
          if (uVar11 <= uVar3) {
            lVar7 = 0;
            uVar11 = 0;
            do {
              uVar14 = *(long *)((long)curve_n + lVar7) + uVar11;
              puVar2 = (ulong *)((long)z + lVar7 + 0x18);
              uVar3 = *puVar2;
              *puVar2 = *puVar2 - uVar14;
              if (uVar14 != 0) {
                uVar11 = (ulong)(uVar3 < uVar14);
              }
              lVar7 = lVar7 + 8;
            } while (lVar7 != 0x20);
          }
LAB_0011918b:
          lVar7 = 3;
          uVar11 = 0;
          do {
            uVar11 = uVar11 | ty[lVar7 + 3] ^ z[lVar7 + 3];
            bVar15 = lVar7 != 0;
            lVar7 = lVar7 + -1;
          } while (bVar15);
          uVar5 = (uint)(uVar11 == 0);
        }
      }
    }
  }
  return uVar5;
}

Assistant:

int uECC_verify(const uint8_t public_key[uECC_BYTES*2],
                const uint8_t hash[uECC_BYTES],
                const uint8_t signature[uECC_BYTES*2]) {
    uECC_word_t u1[uECC_N_WORDS], u2[uECC_N_WORDS];
    uECC_word_t z[uECC_N_WORDS];
    EccPoint public, sum;
    uECC_word_t rx[uECC_WORDS];
    uECC_word_t ry[uECC_WORDS];
    uECC_word_t tx[uECC_WORDS];
    uECC_word_t ty[uECC_WORDS];
    uECC_word_t tz[uECC_WORDS];
    const EccPoint *points[4];
    const EccPoint *point;
    bitcount_t numBits;
    bitcount_t i;
    uECC_word_t r[uECC_N_WORDS], s[uECC_N_WORDS];
    r[uECC_N_WORDS - 1] = 0;
    s[uECC_N_WORDS - 1] = 0;

    vli_bytesToNative(public.x, public_key);
    vli_bytesToNative(public.y, public_key + uECC_BYTES);
    vli_bytesToNative(r, signature);
    vli_bytesToNative(s, signature + uECC_BYTES);

    if (vli_isZero(r) || vli_isZero(s)) { /* r, s must not be 0. */
        return 0;
    }

#if (uECC_CURVE != uECC_secp160r1)
    if (vli_cmp(curve_n, r) != 1 || vli_cmp(curve_n, s) != 1) { /* r, s must be < n. */
        return 0;
    }
#endif

    /* Calculate u1 and u2. */
    vli_modInv_n(z, s, curve_n); /* Z = s^-1 */
    u1[uECC_N_WORDS - 1] = 0;
    vli_bytesToNative(u1, hash);
    vli_modMult_n(u1, u1, z); /* u1 = e/s */
    vli_modMult_n(u2, r, z); /* u2 = r/s */

    /* Calculate sum = G + Q. */
    vli_set(sum.x, public.x);
    vli_set(sum.y, public.y);
    vli_set(tx, curve_G.x);
    vli_set(ty, curve_G.y);
    vli_modSub_fast(z, sum.x, tx); /* Z = x2 - x1 */
    XYcZ_add(tx, ty, sum.x, sum.y);
    vli_modInv(z, z, curve_p); /* Z = 1/Z */
    apply_z(sum.x, sum.y, z);

    /* Use Shamir's trick to calculate u1*G + u2*Q */
    points[0] = 0;
    points[1] = &curve_G;
    points[2] = &public;
    points[3] = &sum;
    numBits = smax(vli_numBits(u1, uECC_N_WORDS), vli_numBits(u2, uECC_N_WORDS));

    point = points[(!!vli_testBit(u1, numBits - 1)) | ((!!vli_testBit(u2, numBits - 1)) << 1)];
    vli_set(rx, point->x);
    vli_set(ry, point->y);
    vli_clear(z);
    z[0] = 1;

    for (i = numBits - 2; i >= 0; --i) {
        uECC_word_t index;
        EccPoint_double_jacobian(rx, ry, z);

        index = (!!vli_testBit(u1, i)) | ((!!vli_testBit(u2, i)) << 1);
        point = points[index];
        if (point) {
            vli_set(tx, point->x);
            vli_set(ty, point->y);
            apply_z(tx, ty, z);
            vli_modSub_fast(tz, rx, tx); /* Z = x2 - x1 */
            XYcZ_add(tx, ty, rx, ry);
            vli_modMult_fast(z, z, tz);
        }
    }

    vli_modInv(z, z, curve_p); /* Z = 1/Z */
    apply_z(rx, ry, z);

    /* v = x1 (mod n) */
#if (uECC_CURVE != uECC_secp160r1)
    if (vli_cmp(curve_n, rx) != 1) {
        vli_sub(rx, rx, curve_n);
    }
#endif

    /* Accept only if v == r. */
    return vli_equal(rx, r);
}